

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

Abc_Cex_t *
Bmc_CexCareBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexImpl,Abc_Cex_t *pCexEss,
               int fFindAll,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  Abc_Cex_t *pCex;
  Vec_Int_t *pVVar4;
  sbyte sVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *__format;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int local_58;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x22c,
                  "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                 );
  }
  pCex = Abc_CexAlloc(0,p->vCis->nSize,pCexState->iFrame + 1);
  iVar1 = pCexState->iFrame;
  pCex->iPo = pCexState->iPo;
  pCex->iFrame = iVar1;
  Gia_ManCleanMark01(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  iVar1 = pCexState->iFrame;
  if (-1 < iVar1) {
    pVVar4 = p->vCis;
    local_58 = iVar1 + 1;
    do {
      if (0 < pVVar4->nSize) {
        iVar7 = pCexState->nPis;
        lVar9 = 0;
        do {
          iVar10 = pVVar4->pArray[lVar9];
          if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_00586a23;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar6 = iVar7 * iVar1 + (int)lVar9;
          iVar14 = (int)uVar6 >> 5;
          uVar6 = uVar6 & 0x1f;
          sVar5 = (sbyte)uVar6;
          pGVar2 = p->pObjs + iVar10;
          uVar12 = *(ulong *)pGVar2 & 0xbfffffffbfffffff |
                   (ulong)(((uint)(&pCexState[1].iPo)[iVar14] >> sVar5 & 1) << 0x1e);
          *(ulong *)pGVar2 = uVar12;
          if (pCexImpl != (Abc_Cex_t *)0x0) {
            uVar12 = uVar12 | (ulong)(((uint)(&pCexImpl[1].iPo)[iVar14] >> uVar6 & 1) != 0) << 0x3e;
            *(ulong *)pGVar2 = uVar12;
          }
          if (pCexEss != (Abc_Cex_t *)0x0) {
            *(ulong *)pGVar2 =
                 uVar12 & 0xbfffffffffffffff |
                 (ulong)(((uint)(uVar12 >> 0x3e) | (uint)(&pCexEss[1].iPo)[iVar14] >> sVar5) & 1) <<
                 0x3e;
          }
          lVar9 = lVar9 + 1;
          pVVar4 = p->vCis;
        } while (lVar9 < pVVar4->nSize);
      }
      if (0 < p->nObjs) {
        lVar9 = 0;
        lVar8 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)(&pGVar2->field_0x0 + lVar9);
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
            uVar11 = (int)(uVar12 & 0x1fffffff) << 2;
            uVar16 = (uint)(uVar12 >> 0x1d) & 7 ^
                     *(uint *)((long)pGVar2 + lVar9 + (ulong)uVar11 * -3) >> 0x1e;
            uVar15 = (uint)(uVar12 >> 0x1e) & 0x7ffffffc;
            uVar6 = *(uint *)((long)pGVar2 + lVar9 + (ulong)uVar15 * -3) >> 0x1e & 1;
            uVar18 = (uint)(uVar12 >> 0x3d) & 1;
            uVar17 = (uVar6 ^ uVar18) & uVar16;
            uVar13 = (ulong)(uVar17 << 0x1e);
            *(ulong *)(&pGVar2->field_0x0 + lVar9) = uVar12 & 0xffffffff3fffffff | uVar13;
            if (uVar17 == 0) {
              if (((uVar16 & 1) == 0) && (uVar6 == uVar18)) {
                uVar12 = uVar12 & 0xbfffffff3fffffff |
                         (*(ulong *)((long)pGVar2 + lVar9 + (ulong)uVar15 * -3) |
                         *(ulong *)((long)pGVar2 + lVar9 + (ulong)uVar11 * -3)) & 0x4000000000000000
                ;
              }
              else {
                if ((uVar16 & 1) == 0) {
                  uVar13 = *(ulong *)((long)pGVar2 + lVar9 + (ulong)uVar11 * -3);
                }
                else {
                  if (uVar6 != uVar18) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                  ,0x250,
                                  "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                                 );
                  }
                  uVar13 = *(ulong *)((long)pGVar2 + lVar9 + (ulong)uVar15 * -3);
                }
                uVar12 = uVar12 & 0xbfffffff3fffffff | uVar13 & 0x4000000000000000;
              }
            }
            else {
              uVar12 = uVar12 & 0xbfffffff3fffffff | uVar13 |
                       *(ulong *)((long)pGVar2 + lVar9 + (ulong)uVar11 * -3) & 0x4000000000000000 &
                       *(ulong *)((long)pGVar2 + lVar9 + (ulong)uVar15 * -3);
            }
            *(ulong *)(&pGVar2->field_0x0 + lVar9) = uVar12;
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar8 < p->nObjs);
      }
      pVVar4 = p->vCos;
      uVar6 = pVVar4->nSize;
      uVar12 = (ulong)uVar6;
      if (0 < (int)uVar6) {
        lVar9 = 0;
        do {
          uVar6 = (uint)uVar12;
          iVar7 = pVVar4->pArray[lVar9];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00586a23;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar7;
          uVar6 = (uint)*(ulong *)pGVar2;
          *(ulong *)pGVar2 =
               *(ulong *)pGVar2 & 0xffffffffbfffffff |
               (ulong)((uVar6 * 2 ^ *(uint *)(pGVar2 + -(ulong)(uVar6 & 0x1fffffff))) & 0x40000000);
          lVar9 = lVar9 + 1;
          pVVar4 = p->vCos;
          uVar6 = pVVar4->nSize;
          uVar12 = (ulong)(int)uVar6;
        } while (lVar9 < (long)uVar12);
      }
      if (iVar1 == pCexState->iFrame) {
        uVar11 = pCexState->iPo;
        if ((int)(uVar6 - p->nRegs) <= (int)uVar11) {
          __assert_fail("v < Gia_ManPoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
        }
        if (((int)uVar11 < 0) || ((int)uVar6 <= (int)uVar11)) {
LAB_00586a42:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar9 = (long)pVVar4->pArray[uVar11];
        if ((lVar9 < 0) || (p->nObjs <= pVVar4->pArray[uVar11])) {
LAB_00586a23:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar6 = (uint)*(undefined8 *)(p->pObjs + lVar9);
        if ((uVar6 >> 0x1e & 1) == 0) {
          __assert_fail("Gia_ManPo(p, pCexState->iPo)->fMark0 == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                        ,599,
                        "Abc_Cex_t *Bmc_CexCareBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, Abc_Cex_t *, int, int)"
                       );
        }
        pGVar2 = p->pObjs + (lVar9 - (ulong)(uVar6 & 0x1fffffff));
        if (fFindAll == 0) {
          Bmc_CexCareBits2_rec(p,pGVar2);
        }
        else {
          Bmc_CexCareBits_rec(p,pGVar2);
        }
      }
      else {
        iVar7 = p->nRegs;
        if (0 < iVar7) {
          iVar10 = 0;
          do {
            iVar14 = p->vCos->nSize;
            uVar6 = (iVar14 - iVar7) + iVar10;
            if (((int)uVar6 < 0) || (iVar14 <= (int)uVar6)) goto LAB_00586a42;
            iVar14 = p->vCos->pArray[uVar6];
            if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00586a23;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            uVar6 = ((pCex->nPis * local_58 + p->vCis->nSize) - iVar7) + iVar10;
            if (((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
              pGVar2 = p->pObjs + iVar14;
              if (fFindAll == 0) {
                Bmc_CexCareBits2_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
              }
              else {
                Bmc_CexCareBits_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
              }
            }
            iVar10 = iVar10 + 1;
            iVar7 = p->nRegs;
          } while (iVar10 < iVar7);
        }
      }
      pVVar4 = p->vCis;
      if (0 < pVVar4->nSize) {
        lVar9 = 0;
        do {
          iVar7 = pVVar4->pArray[lVar9];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00586a23;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar7;
          uVar12 = *(ulong *)pGVar2;
          if ((uVar12 & 0x4000000000000000) != 0) {
            *(ulong *)pGVar2 = uVar12 & 0xbfffffffffffffff;
            lVar8 = (ulong)(uint)(pCex->nPis * iVar1) + lVar9;
            uVar6 = (uint)lVar8;
            iVar7 = (int)uVar6 >> 5;
            if ((pCexImpl == (Abc_Cex_t *)0x0) ||
               (((uint)(&pCexImpl[1].iPo)[iVar7] >> (uVar6 & 0x1f) & 1) == 0)) {
              (&pCex[1].iPo)[iVar7] = (&pCex[1].iPo)[iVar7] | 1 << ((byte)lVar8 & 0x1f);
            }
          }
          lVar9 = lVar9 + 1;
          pVVar4 = p->vCis;
        } while (lVar9 < pVVar4->nSize);
      }
      local_58 = local_58 + -1;
      bVar3 = 0 < iVar1;
      iVar1 = iVar1 + -1;
    } while (bVar3);
  }
  __format = "Minimized:    ";
  if (pCexEss == (Abc_Cex_t *)0x0) {
    __format = "Care bits:    ";
  }
  printf(__format);
  Bmc_CexPrint(pCex,p->vCis->nSize - p->nRegs,fVerbose);
  return pCex;
}

Assistant:

Abc_Cex_t * Bmc_CexCareBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexImpl, Abc_Cex_t * pCexEss, int fFindAll, int fVerbose )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int fCompl0, fCompl1;
    int i, k, iBit;
    assert( pCexState->nRegs == 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = pCexState->iFrame; i >= 0; i-- )
    {
        // set correct values
        iBit = pCexState->nPis * i;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit(pCexState->pData, iBit+k);
            pObj->fMark1 = 0;
            if ( pCexImpl )
                pObj->fMark1 |= Abc_InfoHasBit(pCexImpl->pData, iBit+k);
            if ( pCexEss )
                pObj->fMark1 |= Abc_InfoHasBit(pCexEss->pData, iBit+k);
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        // move values from COs to CIs
        if ( i == pCexState->iFrame )
        {
            assert( Gia_ManPo(p, pCexState->iPo)->fMark0 == 1 );
            if ( fFindAll )
                Bmc_CexCareBits_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
            else
                Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(Gia_ManPo(p, pCexState->iPo)) );
        }
        else
        {
            Gia_ManForEachRi( p, pObj, k )
                if ( Abc_InfoHasBit(pNew->pData, pNew->nPis * (i+1) + Gia_ManPiNum(p) + k) )
                {
                     if ( fFindAll )
                         Bmc_CexCareBits_rec( p, Gia_ObjFanin0(pObj) );
                     else
                         Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
                }
        }
        // save the results
        Gia_ManForEachCi( p, pObj, k )
            if ( pObj->fMark1 )
            {
                pObj->fMark1 = 0;
                if ( pCexImpl == NULL || !Abc_InfoHasBit(pCexImpl->pData, pNew->nPis * i + k) )
                    Abc_InfoSetBit(pNew->pData, pNew->nPis * i + k);
            }
    }
    if ( pCexEss )
        printf( "Minimized:    " );
    else
        printf( "Care bits:    " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}